

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O1

bool __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::optimizeSubsequentStructSet
          (HeapStoreOptimization *this,StructNew *new_,StructSet *set,LocalSet *localSet)

{
  ExpressionList *this_00;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar1;
  size_t *psVar2;
  size_t *__return_storage_ptr__;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pFVar6;
  char cVar7;
  ulong uVar8;
  Struct *pSVar9;
  Expression *item;
  Drop *left;
  Block *pBVar10;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar11;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar12;
  uint uVar13;
  pointer pFVar14;
  bool bVar15;
  optional<wasm::Type> type;
  undefined1 local_330 [8];
  EffectAnalyzer setValueEffects;
  EffectAnalyzer operandEffects;
  Builder local_48;
  Builder builder;
  
  if (((new_->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id == 1) ||
     ((set->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id == 1)) {
    return false;
  }
  uVar13 = set->index;
  uVar8 = (ulong)uVar13;
  uVar3 = localSet->index;
  builder.wasm = (Module *)set;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_330,
             &((this->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
             ).
             super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
             .
             super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
             .currModule,set->value);
  psVar1 = &setValueEffects.localsRead;
  psVar11 = psVar1;
  for (; (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
         setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
         (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x0;
      setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (&(((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
              setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_)->_M_t).
             _M_impl.super__Rb_tree_header._M_header._M_parent)[bVar15]) {
    bVar15 = *(uint *)&(((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                            _0_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right < uVar3;
    if (!bVar15) {
      psVar11 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    }
  }
  psVar12 = psVar1;
  if ((psVar11 != psVar1) &&
     (psVar12 = psVar11,
     uVar3 < *(uint *)&(psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
    psVar12 = psVar1;
  }
  if (psVar12 == psVar1) {
    psVar1 = &setValueEffects.localsWritten;
    psVar11 = psVar1;
    for (; (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
           setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
           (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x0;
        setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (&(((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_)->
               _M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)[bVar15]) {
      bVar15 = *(uint *)&(((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                              _M_header._0_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_right < uVar3;
      if (!bVar15) {
        psVar11 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      }
    }
    psVar12 = psVar1;
    if ((psVar11 != psVar1) &&
       (psVar12 = psVar11,
       uVar3 < *(uint *)&(psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
      psVar12 = psVar1;
    }
    if (psVar12 == psVar1) {
      this_00 = &new_->operands;
      if ((new_->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements ==
          0) {
LAB_008dcd2c:
        if ((((setValueEffects.module._4_1_ != '\0') || (setValueEffects.writesTable != false)) ||
            (setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right
             != (_Base_ptr)0x0)) ||
           (setValueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
            (_Base_ptr)0x0)) {
          if ((this->localGraph).super__Optional_base<wasm::LazyLocalGraph,_false,_false>._M_payload
              .super__Optional_payload<wasm::LazyLocalGraph,_true,_false,_false>.
              super__Optional_payload_base<wasm::LazyLocalGraph>._M_engaged == false) {
            setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)(this->
                         super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                         ).
                         super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                         .currFunction;
            local_48.wasm =
                 (this->
                 super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                 ).
                 super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                 .currModule;
            std::optional<wasm::LazyLocalGraph>::
            emplace<wasm::Function*,wasm::Module*,wasm::Expression::Id_const&>
                      (&this->localGraph,
                       (Function **)
                       &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count,&local_48.wasm,
                       &SpecificExpression<(wasm::Expression::Id)67>::SpecificId);
          }
          LazyLocalGraph::canMoveSet
                    ((SetInfluences *)
                     &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count,(LazyLocalGraph *)&this->localGraph,localSet,
                     (Expression *)builder.wasm);
          psVar2 = &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
          ;
          if (operandEffects._16_8_ != 0) {
            if (operandEffects._16_8_ == 1) {
              puVar4 = ((operandEffects.module)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              puVar5 = (pointer)((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              std::
              _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)psVar2);
              if (puVar4 == puVar5) goto LAB_008dcdfb;
            }
            else {
              std::
              _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)psVar2);
            }
            goto LAB_008dcc09;
          }
          std::
          _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)psVar2);
        }
LAB_008dcdfb:
        local_48.wasm =
             (this->
             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
             ).
             super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
             .
             super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
             .currModule;
        if ((new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            == 0) {
          setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)wasm::Type::getHeapType
                                 (&(new_->super_SpecificExpression<(wasm::Expression::Id)65>).
                                   super_Expression.type);
          pSVar9 = HeapType::getStruct((HeapType *)
                                       &setValueEffects.delegateTargets._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count);
          pFVar14 = (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar6 = (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pFVar14 != pFVar6) {
            __return_storage_ptr__ =
                 &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
            psVar2 = &operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count;
            do {
              Literal::makeZero((Literal *)__return_storage_ptr__,(Type)(pFVar14->type).id);
              Literal::Literal((Literal *)psVar2,(Literal *)__return_storage_ptr__);
              item = Builder::makeConstantExpression(&local_48,(Literal *)psVar2);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,item);
              Literal::~Literal((Literal *)psVar2);
              Literal::~Literal((Literal *)__return_storage_ptr__);
              pFVar14 = pFVar14 + 1;
            } while (pFVar14 != pFVar6);
          }
        }
        if ((new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar8) goto LAB_008dcf6b;
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)
                   &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                   ,&((this->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                      ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                   ).
                   super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                   .currModule,
                   (this_00->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                   [uVar8]);
        bVar15 = EffectAnalyzer::hasNonTrapSideEffects
                           ((EffectAnalyzer *)
                            &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
        if (bVar15) {
          EffectAnalyzer::~EffectAnalyzer
                    ((EffectAnalyzer *)
                     &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
LAB_008dced8:
          if ((new_->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar8) {
LAB_008dcf6b:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          left = Builder::makeDrop(&local_48,
                                   (this_00->
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ).data[uVar8]);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)builder.wasm
          ;
          pBVar10 = Builder::makeSequence
                              (&local_48,(Expression *)left,
                               (Expression *)
                               ((builder.wasm)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,type);
          if ((new_->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar8) goto LAB_008dcf6b;
        }
        else {
          if (operandEffects.readsMemory == true) {
            cVar7 = setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    ._1_1_;
            EffectAnalyzer::~EffectAnalyzer
                      ((EffectAnalyzer *)
                       &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
            if (cVar7 == '\0') goto LAB_008dced8;
          }
          else {
            EffectAnalyzer::~EffectAnalyzer
                      ((EffectAnalyzer *)
                       &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
          }
          if ((new_->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar8) goto LAB_008dcf6b;
          pBVar10 = (Block *)((builder.wasm)->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
        [uVar8] = (Expression *)pBVar10;
        bVar15 = true;
        goto LAB_008dcc0b;
      }
      psVar2 = &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      do {
        uVar13 = uVar13 + 1;
        if ((new_->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= (ulong)uVar13) goto LAB_008dcd2c;
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)psVar2,
                   &((this->
                     super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                   ).
                   super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                   .currModule,
                   (this_00->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                   [uVar13]);
        bVar15 = EffectAnalyzer::invalidates((EffectAnalyzer *)psVar2,(EffectAnalyzer *)local_330);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&operandEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                   );
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&operandEffects.danglingPop);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&operandEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&operandEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&operandEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&operandEffects.features);
      } while (!bVar15);
    }
  }
LAB_008dcc09:
  bVar15 = false;
LAB_008dcc0b:
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&setValueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&setValueEffects.features);
  return bVar15;
}

Assistant:

bool optimizeSubsequentStructSet(StructNew* new_,
                                   StructSet* set,
                                   LocalSet* localSet) {
    // Leave unreachable code for DCE, to avoid updating types here.
    if (new_->type == Type::unreachable || set->type == Type::unreachable) {
      return false;
    }

    auto index = set->index;
    auto& operands = new_->operands;
    auto refLocalIndex = localSet->index;

    // Check for effects that prevent us moving the struct.set's value (X' in
    // the function comment) into its new position in the struct.new. First, it
    // must be ok to move it past the local.set (otherwise, it might read from
    // memory using that local, and depend on the struct.new having already
    // occurred; or, if it writes to that local, then it would cross another
    // write).
    auto setValueEffects = effects(set->value);
    if (setValueEffects.localsRead.count(refLocalIndex) ||
        setValueEffects.localsWritten.count(refLocalIndex)) {
      return false;
    }

    // We must move the set's value past indexes greater than it (Y and Z in
    // the example in the comment on this function). If this is not with_default
    // then we must check for effects.
    // TODO When this function is called repeatedly in a sequence this can
    //      become quadratic - perhaps we should memoize (though, struct sizes
    //      tend to not be ridiculously large).
    if (!new_->isWithDefault()) {
      for (Index i = index + 1; i < operands.size(); i++) {
        auto operandEffects = effects(operands[i]);
        if (operandEffects.invalidates(setValueEffects)) {
          // TODO: we could use locals to reorder everything
          return false;
        }
      }
    }

    // We must also be careful of branches out from the value that skip the
    // local.set, see below.
    if (canSkipLocalSet(set, setValueEffects, localSet)) {
      return false;
    }

    // We can optimize here!
    Builder builder(*getModule());

    // If this was with_default then we add default values now. That does
    // increase code size in some cases (if there are many values, and few sets
    // that get removed), but in general this optimization is worth it.
    if (new_->isWithDefault()) {
      auto& fields = new_->type.getHeapType().getStruct().fields;
      for (auto& field : fields) {
        auto zero = Literal::makeZero(field.type);
        operands.push_back(builder.makeConstantExpression(zero));
      }
    }

    // See if we need to keep the old value.
    if (effects(operands[index]).hasUnremovableSideEffects()) {
      operands[index] =
        builder.makeSequence(builder.makeDrop(operands[index]), set->value);
    } else {
      operands[index] = set->value;
    }

    return true;
  }